

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxGetClass::Emit(FxGetClass *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  undefined4 extraout_var;
  ExpEmit local_28;
  ExpEmit op;
  VMFunctionBuilder *build_local;
  FxGetClass *this_local;
  ExpEmit to;
  
  op = (ExpEmit)build;
  local_28._0_4_ = (*this->Self->_vptr_FxExpression[9])(this->Self,build);
  local_28.Konst = (bool)(char)extraout_var;
  local_28.Fixed = (bool)(char)((uint)extraout_var >> 8);
  local_28.Final = (bool)(char)((uint)extraout_var >> 0x10);
  local_28.Target = (bool)(char)((uint)extraout_var >> 0x18);
  ExpEmit::Free(&local_28,(VMFunctionBuilder *)op);
  ExpEmit::ExpEmit((ExpEmit *)&this_local,(VMFunctionBuilder *)op,3,1);
  VMFunctionBuilder::Emit((VMFunctionBuilder *)op,0xb,(uint)(ushort)this_local,local_28.RegNum);
  EVar1.RegType = this_local._2_1_;
  EVar1.RegCount = this_local._3_1_;
  EVar1.Konst = (bool)this_local._4_1_;
  EVar1.Fixed = (bool)this_local._5_1_;
  EVar1.Final = (bool)this_local._6_1_;
  EVar1.Target = (bool)this_local._7_1_;
  EVar1.RegNum = (ushort)this_local;
  return EVar1;
}

Assistant:

ExpEmit FxGetClass::Emit(VMFunctionBuilder *build)
{
	ExpEmit op = Self->Emit(build);
	op.Free(build);
	ExpEmit to(build, REGT_POINTER);
	build->Emit(OP_META, to.RegNum, op.RegNum);
	return to;
}